

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsQuerySetTarget(HelicsQuery query,char *target,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (query == (HelicsQuery)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019b9d4;
    }
    else {
      bVar3 = *(int *)((long)query + 0x7c) == 0x27063885;
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar3) {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)query;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019b9d7;
    }
    err->error_code = -3;
    err->message = "Query object is invalid";
  }
LAB_0019b9d4:
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0019b9d7:
  if (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (target == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(target);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,target,target + sVar2);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsQuerySetTarget(HelicsQuery query, const char* target, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->target = AS_STRING(target);
}